

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int precedence(string *token)

{
  bool bVar1;
  string *token_local;
  
  bVar1 = std::operator==(token,"=");
  if (bVar1) {
    token_local._4_4_ = 1;
  }
  else {
    bVar1 = std::operator==(token,"+");
    if ((!bVar1) && (bVar1 = std::operator==(token,"-"), !bVar1)) {
      bVar1 = std::operator==(token,"*");
      if ((!bVar1) && (bVar1 = std::operator==(token,"/"), !bVar1)) {
        return 0;
      }
      return 3;
    }
    token_local._4_4_ = 2;
  }
  return token_local._4_4_;
}

Assistant:

int precedence(string token) {
   if (token == "=") return 1;
   if (token == "+" || token == "-") return 2;
   if (token == "*" || token == "/") return 3;
   return 0;
}